

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *ci_00;
  Proto *p;
  int iVar1;
  char *local_40;
  char *local_30;
  char *kind;
  CallInfo *ci;
  char *name;
  TValue *o_local;
  lua_State *L_local;
  
  ci = (CallInfo *)0x0;
  ci_00 = L->ci;
  local_30 = (char *)0x0;
  name = (char *)o;
  o_local = (TValue *)L;
  if ((((ci_00->callstatus & 2) != 0) &&
      (local_30 = getupvalname(ci_00,o,(char **)&ci), local_30 == (char *)0x0)) &&
     (iVar1 = isinstack(ci_00,(TValue *)name), iVar1 != 0)) {
    p = *(Proto **)((ci_00->func->value_).f + 0x18);
    iVar1 = currentpc(ci_00);
    local_30 = getobjname(p,iVar1,(int)((long)name - (long)(ci_00->u).l.base >> 4),(char **)&ci);
  }
  if (local_30 == (char *)0x0) {
    local_40 = "";
  }
  else {
    local_40 = luaO_pushfstring((lua_State *)o_local," (%s \'%s\')",local_30,ci);
  }
  return local_40;
}

Assistant:

static const char *varinfo(lua_State *L, const TValue *o) {
    const char *name = NULL;  /* to avoid warnings */
    CallInfo *ci = L->ci;
    const char *kind = NULL;
    if (isLua(ci)) {
        kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
        if (!kind && isinstack(ci, o))  /* no? try a register */
            kind = getobjname(ci_func(ci)->p, currentpc(ci),
                              cast_int(o - ci->u.l.base), &name);
    }
    return (kind) ? luaO_pushfstring(L, " (%s '%s')", kind, name) : "";
}